

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O0

QDateTime __thiscall QFSFileEngine::fileTime(QFSFileEngine *this,FileTime time)

{
  long lVar1;
  bool bVar2;
  QFSFileEnginePrivate *this_00;
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> flags;
  int in_EDX;
  Data in_RDI;
  long in_FS_OFFSET;
  QFSFileEnginePrivate *d;
  MetaDataFlag in_stack_ffffffffffffffac;
  QFileSystemMetaData *in_stack_ffffffffffffffb0;
  FileTime time_00;
  Data this_01;
  Data DVar3;
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> flags_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  DVar3 = in_RDI;
  this_00 = d_func((QFSFileEngine *)0x1353cb);
  time_00 = in_RDI._4_4_;
  flags_00.i = DVar3._4_4_;
  if (in_EDX == 0) {
    flags.i = (Int)((ulong)&this_00->metaData >> 0x20);
    QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags
              (&in_stack_ffffffffffffffb0->knownFlagsMask,in_stack_ffffffffffffffac);
    QFileSystemMetaData::clearFlags(in_stack_ffffffffffffffb0,(MetaDataFlags)flags.i);
  }
  QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags
            ((QFlags<QFileSystemMetaData::MetaDataFlag> *)this_00,in_stack_ffffffffffffffac);
  bVar2 = QFSFileEnginePrivate::doStat(this_00,(MetaDataFlags)flags_00.i);
  if (bVar2) {
    QFileSystemMetaData::fileTime((QFileSystemMetaData *)this_01.d,time_00);
  }
  else {
    QDateTime::QDateTime((QDateTime *)0x135452);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDateTime)this_01;
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QFSFileEngine::fileTime(QFile::FileTime time) const
{
    Q_D(const QFSFileEngine);

    if (time == QFile::FileAccessTime) {
        // always refresh for the access time
        d->metaData.clearFlags(QFileSystemMetaData::AccessTime);
    }

    if (d->doStat(QFileSystemMetaData::Times))
        return d->metaData.fileTime(time);

    return QDateTime();
}